

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

size_type __thiscall mserialize::string_view::find(string_view *this,string_view s,size_type pos)

{
  bool bVar1;
  size_type sVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  const_iterator s_first;
  const_iterator s_last;
  ulong in_RCX;
  string_view *in_RDI;
  const_iterator iter;
  size_type local_78;
  string_view local_18;
  size_type local_8;
  
  sVar2 = size(in_RDI);
  if (sVar2 < in_RCX) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    bVar1 = empty(&local_18);
    local_8 = in_RCX;
    if (!bVar1) {
      pcVar3 = cbegin(in_RDI);
      pcVar4 = cend(in_RDI);
      s_first = cbegin(&local_18);
      s_last = cend(&local_18);
      pcVar3 = search(pcVar3 + in_RCX,pcVar4,s_first,s_last);
      pcVar4 = cend(in_RDI);
      if (pcVar3 == pcVar4) {
        local_78 = 0xffffffffffffffff;
      }
      else {
        pcVar4 = cbegin(in_RDI);
        local_78 = (long)pcVar3 - (long)pcVar4;
      }
      local_8 = local_78;
    }
  }
  return local_8;
}

Assistant:

size_type find(string_view s, size_type pos = 0) const noexcept
  {
    if (pos > size()) { return npos; }
    if (s.empty()) { return pos; }
    const_iterator iter = search(cbegin() + pos, cend(), s.cbegin(), s.cend());
    return iter == cend() ? npos : size_type(iter - cbegin());
  }